

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
          (PersistentStorageJson *this,Registrar *aValue,
          vector<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
          *aRet)

{
  undefined8 uVar1;
  Status SVar2;
  Registrar *this_00;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  string local_b0;
  function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> local_90;
  Registrar local_70;
  _Any_data __tmp;
  
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  pcStack_e0 = std::
               _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:331:51)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:331:51)>
             ::_M_manager;
  Registrar::Registrar(&local_70,aValue);
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  this_00 = (Registrar *)operator_new(0x48);
  Registrar::Registrar(this_00,&local_70);
  uVar1 = local_d8._8_8_;
  local_c8 = local_e8;
  local_d8._M_unused._M_object = local_f8._M_unused._M_object;
  local_d8._8_8_ = local_f8._8_8_;
  local_f8._8_8_ = uVar1;
  local_e8 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:333:12)>
             ::_M_manager;
  pcStack_c0 = pcStack_e0;
  pcStack_e0 = std::
               _Function_handler<bool_(const_ot::commissioner::persistent_storage::Registrar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:333:12)>
               ::_M_invoke;
  local_f8._M_unused._M_object = this_00;
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  Registrar::~Registrar(&local_70);
  std::function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)>::function
            (&local_90,
             (function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *)&local_f8);
  std::__cxx11::string::string((string *)&local_b0,(string *)JSON_RGR_abi_cxx11_);
  SVar2 = LookupPred<ot::commissioner::persistent_storage::Registrar>(this,&local_90,aRet,&local_b0)
  ;
  std::__cxx11::string::~string((string *)&local_b0);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  return SVar2;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Lookup(Registrar const &aValue, std::vector<Registrar> &aRet)
{
    std::function<bool(Registrar const &)> pred = [](Registrar const &) { return true; };

    pred = [aValue](Registrar const &el) {
        bool aRet = (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) &&
                    (aValue.mAddr.empty() || CaseInsensitiveEqual(aValue.mAddr, el.mAddr)) &&
                    (aValue.mPort == 0 || (aValue.mPort == el.mPort));

        if (aRet && !aValue.mDomains.empty())
        {
            std::vector<std::string> el_tmp(el.mDomains);
            std::vector<std::string> aValue_tmp(aValue.mDomains);
            std::sort(std::begin(el_tmp), std::end(el_tmp));
            std::sort(std::begin(aValue_tmp), std::end(aValue_tmp));
            aRet = std::includes(std::begin(el_tmp), std::end(el_tmp), std::begin(aValue_tmp), std::end(aValue_tmp));
        }
        return aRet;
    };

    return LookupPred<Registrar>(pred, aRet, JSON_RGR);
}